

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseEditInsert(linenoiseState *l,char *cbuf,int clen)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  ssize_t sVar5;
  size_t __n;
  char *pcVar6;
  long lVar7;
  size_t __n_00;
  ulong uVar8;
  size_t col_len;
  long local_38;
  
  __n_00 = (size_t)clen;
  if (l->len + __n_00 <= l->buflen) {
    pcVar6 = l->buf + l->pos;
    __n = l->len - l->pos;
    if (__n == 0) {
      memcpy(pcVar6,cbuf,__n_00);
      l->pos = l->pos + __n_00;
      sVar3 = l->len + __n_00;
      l->len = sVar3;
      l->buf[sVar3] = '\0';
      if (mlmode == 0) {
        sVar3 = promptTextColumnLen(l->prompt,l->plen);
        uVar1 = l->len;
        if (uVar1 == 0) {
          lVar7 = 0;
        }
        else {
          pcVar6 = l->buf;
          lVar7 = 0;
          uVar8 = 0;
          do {
            lVar4 = (*(code *)nextCharLen)(pcVar6,uVar1,uVar8,&local_38);
            uVar8 = uVar8 + lVar4;
            lVar7 = lVar7 + local_38;
          } while (uVar8 < uVar1);
        }
        if ((lVar7 + sVar3 < l->cols) && (hintsCallback == (linenoiseHintsCallback *)0x0)) {
          if (maskmode == '\x01') {
            cbuf = "*\x1b[H\x1b[2J";
            __n_00 = 1;
          }
          sVar5 = write(l->ofd,cbuf,__n_00);
          if (sVar5 != -1) {
            return 0;
          }
          return -1;
        }
      }
    }
    else {
      memmove(pcVar6 + __n_00,pcVar6,__n);
      memcpy(l->buf + l->pos,cbuf,__n_00);
      l->pos = l->pos + __n_00;
      sVar3 = __n_00 + l->len;
      l->len = sVar3;
      l->buf[sVar3] = '\0';
    }
    iVar2 = getColumns(0,1);
    l->cols = (long)iVar2;
    refreshLineWithFlags(l,3);
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, const char *cbuf, int clen) {
    if (l->len+clen <= l->buflen) {
        if (l->len == l->pos) {
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;;
            l->buf[l->len] = '\0';
            if ((!mlmode && promptTextColumnLen(l->prompt,l->plen)+columnPos(l->buf,l->len,l->len) < l->cols && !hintsCallback)) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (maskmode == 1) {
                  static const char d = '*';
                  if (write(l->ofd,&d,1) == -1) return -1;
                } else {
                  if (write(l->ofd,cbuf,clen) == -1) return -1;
                }
            } else {
                refreshLine(l);
            }
        } else {
            memmove(l->buf+l->pos+clen,l->buf+l->pos,l->len-l->pos);
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;
            l->buf[l->len] = '\0';
            refreshLine(l);
        }
    }
    return 0;
}